

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

uint Abc_TtCanonicizeWrap
               (TtCanonicizeFunc func,Abc_TtHieMan_t *p,word *pTruth,int nVars,char *pCanonPerm,
               int flag)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  char pCanonPerm2 [16];
  char local_48 [24];
  
  bVar1 = (byte)nVars;
  uVar5 = 1 << (bVar1 - 6 & 0x1f);
  if (nVars < 7) {
    uVar5 = 1;
  }
  if (nVars < 6) {
    uVar3 = 1 << (bVar1 & 0x1f);
    uVar8 = ~(-1L << ((byte)uVar3 & 0x3f)) & *pTruth;
    *pTruth = uVar8;
    uVar7 = (ulong)uVar3;
    uVar9 = uVar8;
    if ((uint)nVars < 6) {
      do {
        uVar9 = uVar9 | uVar8 << ((byte)uVar7 & 0x3f);
        uVar7 = uVar7 + uVar3;
      } while (uVar7 < 0x40);
      *pTruth = uVar9;
    }
    if (nVars < 6) {
      uVar3 = 1 << (bVar1 & 0x1f);
      uVar8 = ~(-1L << ((byte)uVar3 & 0x3f)) & *pTruth;
      uVar7 = (ulong)uVar3;
      uVar9 = uVar8;
      if ((uint)nVars < 6) {
        do {
          uVar9 = uVar9 | uVar8 << ((byte)uVar7 & 0x3f);
          uVar7 = uVar7 + uVar3;
        } while (uVar7 < 0x40);
      }
      if (*pTruth != uVar9) {
        __assert_fail("*pTruth == nTruth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                      ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
      }
    }
  }
  uVar7 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    iVar6 = 0;
  }
  else {
    uVar9 = 0;
    iVar6 = 0;
    do {
      uVar8 = pTruth[uVar9];
      if (uVar8 != 0) {
        uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
        uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
        uVar8 = (uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f;
        uVar8 = (uVar8 >> 8) + uVar8;
        lVar10 = (uVar8 >> 0x10) + uVar8;
        iVar6 = iVar6 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU);
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (iVar6 == uVar5 * 0x20) {
    if (0 < (int)uVar5) {
      lVar10 = 0;
      do {
        *(ulong *)((long)Abc_TtCanonicizeWrap::pTruth2 + lVar10) =
             ~*(ulong *)((long)pTruth + lVar10);
        lVar10 = lVar10 + 8;
      } while (uVar7 * 8 - lVar10 != 0);
    }
    uVar3 = (*func)(p,pTruth,nVars,pCanonPerm,flag);
    uVar4 = (*func)(p,Abc_TtCanonicizeWrap::pTruth2,nVars,local_48,flag);
    uVar9 = uVar7;
    do {
      if ((int)uVar9 < 1) {
        return uVar3;
      }
      lVar2 = uVar9 + 0x3ff;
      lVar10 = uVar9 - 1;
      uVar9 = uVar9 - 1;
    } while (pTruth[lVar10] == Abc_TtCanonicizePhase::pCopy2[lVar2]);
    if (Abc_TtCanonicizePhase::pCopy2[lVar2] <= pTruth[lVar10]) {
      if (0 < (int)uVar5) {
        lVar10 = 0;
        do {
          *(undefined8 *)((long)pTruth + lVar10) =
               *(undefined8 *)((long)Abc_TtCanonicizeWrap::pTruth2 + lVar10);
          lVar10 = lVar10 + 8;
        } while (uVar7 << 3 != lVar10);
      }
      memcpy(pCanonPerm,local_48,(long)nVars);
      uVar3 = uVar4;
    }
    return uVar3;
  }
  uVar5 = (*func)(p,pTruth,nVars,pCanonPerm,flag);
  return uVar5;
}

Assistant:

unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag)
{
    int nWords = Abc_TtWordNum(nVars);
    unsigned uCanonPhase1, uCanonPhase2;
    char pCanonPerm2[16];
    static word pTruth2[1024];

    Abc_TtNormalizeSmallTruth(pTruth, nVars);
    if (Abc_TtCountOnesInTruth(pTruth, nVars) != nWords * 32)
        return func(p, pTruth, nVars, pCanonPerm, flag);
    Abc_TtCopy(pTruth2, pTruth, nWords, 1);
    uCanonPhase1 = func(p, pTruth, nVars, pCanonPerm, flag);
    uCanonPhase2 = func(p, pTruth2, nVars, pCanonPerm2, flag);
    if (Abc_TtCompareRev(pTruth, pTruth2, nWords) <= 0)
        return uCanonPhase1;
    Abc_TtCopy(pTruth, pTruth2, nWords, 0);
    memcpy(pCanonPerm, pCanonPerm2, nVars);
    return uCanonPhase2;
}